

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_aligned.cc
# Opt level: O2

void produce<long,disruptor::MultiThreadedStrategyEx,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>>
               (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
                *s)

{
  pointer pAVar1;
  ulong in_RAX;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int64_t sequence;
  ulong local_28;
  
  lVar4 = 0;
  local_28 = in_RAX;
  lVar5 = RING_BUFFER_SIZE * counter;
  if ((long)(RING_BUFFER_SIZE * counter) < 1) {
    lVar5 = lVar4;
  }
  for (; lVar4 != lVar5; lVar4 = lVar4 + 1) {
    local_28 = disruptor::
               Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
               ::Claim(s,delta);
    uVar2 = (ulong)(s->ring_buffer_).index_mask_;
    pAVar1 = (s->ring_buffer_).events_.
             super__Vector_base<disruptor::RingBuffer<long,_64>::AlignedElement,_std::allocator<disruptor::RingBuffer<long,_64>::AlignedElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = local_28;
    if (local_28 < delta) {
      for (uVar3 = 0; (long)uVar3 <= (long)local_28; uVar3 = uVar3 + 1) {
        pAVar1[uVar3 & uVar2].elem_ = uVar3;
      }
    }
    else {
      for (; local_28 - delta < uVar3; uVar3 = uVar3 - 1) {
        pAVar1[uVar3 & uVar2].elem_ = uVar3;
      }
    }
    disruptor::
    Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_64>
    ::Publish(s,(int64_t *)&local_28,delta);
  }
  return;
}

Assistant:

void produce(disruptor::Sequencer<T, C, W, Alignment>& s) {
  int64_t iterations = counter * RING_BUFFER_SIZE;

  for (int64_t i = 0; i < iterations; ++i) {
    int64_t sequence = s.Claim(delta);

    if (sequence < delta) {
      for (int64_t k = 0; k <= sequence; ++k) {
        s[k] = k;
#ifdef PRINT_DEBUG_PROD
        std::stringstream ss;
        ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id()
           << '\n';
        std::cout << ss.str();
#endif
      }

      s.Publish(sequence, delta);
      continue;
    }

    for (int64_t k = sequence; k > sequence - delta; --k) {
      s[k] = k;

#ifdef PRINT_DEBUG_PROD
      std::stringstream ss;
      ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id() << '\n';
      std::cout << ss.str();
#endif
    }

    s.Publish(sequence, delta);
  }
}